

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::device_tree::write_dts(device_tree *this,int fd)

{
  pointer ppVar1;
  FILE *__stream;
  pair<unsigned_long,_unsigned_long> *i;
  pointer ppVar2;
  char msg [13];
  
  __stream = fdopen(fd,"w");
  fputs("/dts-v1/;\n\n",__stream);
  if ((this->reservations).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->reservations).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    builtin_strncpy(msg + 8,"rve/",5);
    builtin_strncpy(msg,"/memrese",8);
    fwrite(msg,0xc,1,__stream);
    ppVar1 = (this->reservations).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar2 = (this->reservations).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1)
    {
      fprintf(__stream," 0x%lx 0x%lx",ppVar2->first,ppVar2->second);
    }
    fputs(";\n\n",__stream);
  }
  putc(0x2f,__stream);
  putc(0x20,__stream);
  node::write_dts((this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ,(FILE *)__stream,0);
  fclose(__stream);
  return;
}

Assistant:

void
device_tree::write_dts(int fd)
{
	FILE *file = fdopen(fd, "w");
	fputs("/dts-v1/;\n\n", file);

	if (!reservations.empty())
	{
		const char msg[] = "/memreserve/";
		// Exclude the null byte when we're writing it out to the file.
		fwrite(msg, sizeof(msg) - 1, 1, file);
		for (auto &i : reservations)
		{
			fprintf(file, " 0x%" PRIx64 " 0x%" PRIx64, i.first, i.second);
		}
		fputs(";\n\n", file);
	}
	putc('/', file);
	putc(' ', file);
	root->write_dts(file, 0);
	fclose(file);
}